

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod_set.c
# Opt level: O0

acmod_id_t acmod_set_enum_init(acmod_set_t *acmod_set,acmod_id_t base)

{
  cell_index_t ret;
  acmod_id_t base_local;
  acmod_set_t *acmod_set_local;
  
  if (acmod_set->n_multi == 0) {
    acmod_set_local._4_4_ = 0xffffffff;
  }
  else {
    acmod_set_local._4_4_ = itree_enum_init(acmod_set->multi_idx[base]);
    if (acmod_set_local._4_4_ == 0xffffffff) {
      acmod_set_local._4_4_ = 0xffffffff;
    }
  }
  return acmod_set_local._4_4_;
}

Assistant:

acmod_id_t
acmod_set_enum_init(acmod_set_t *acmod_set,
		    acmod_id_t base)
{
    cell_index_t ret;

    if (acmod_set->n_multi == 0) {
	/* none defined */

	return NO_ACMOD;
    }

    ret = itree_enum_init(acmod_set->multi_idx[base]);

    if (ret != NULL_INDEX) {
	return ret;
    }
    else {
	return NO_ACMOD;
    }
}